

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorArkode.H
# Opt level: O2

void __thiscall pele::physics::reactions::ReactorArkode::ReactorArkode(ReactorArkode *this)

{
  (this->super_Register<pele::physics::reactions::ReactorArkode>).super_ReactorBase.verbose = 0;
  memset(&(this->super_Register<pele::physics::reactions::ReactorArkode>).super_ReactorBase.
          m_typ_vals,0,0xb0);
  (this->super_Register<pele::physics::reactions::ReactorArkode>).super_ReactorBase.
  super_Factory<pele::physics::reactions::ReactorBase>._vptr_Factory =
       (_func_int **)&PTR__Register_007d2580;
  this->relTol = 1e-06;
  this->absTol = 1e-10;
  this->use_erkstep = 1;
  this->rk_method = 0x28;
  this->rk_controller = 0;
  this->m_reactor_type = 0;
  this->atomic_reductions = 1;
  this->m_clean_init_massfrac = false;
  return;
}

Assistant:

static std::string identifier() { return "ReactorArkode"; }